

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walker-inl.h
# Opt level: O0

void __thiscall re2::Regexp::Walker<int>::Reset(Walker<int> *this)

{
  size_type sVar1;
  ostream *poVar2;
  reference pvVar3;
  LogMessage *in_RDI;
  int in_stack_fffffffffffffe84;
  char *in_stack_fffffffffffffe88;
  LogMessage *in_stack_fffffffffffffe90;
  
  if ((*(long *)&in_RDI->str_ != 0) &&
     (sVar1 = std::
              stack<re2::WalkState<int>,_std::deque<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>_>
              ::size((stack<re2::WalkState<int>,_std::deque<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>_>
                      *)0x20fa55), sVar1 != 0)) {
    LogMessage::LogMessage
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe84);
    poVar2 = LogMessage::stream((LogMessage *)&stack0xfffffffffffffe78);
    std::operator<<(poVar2,"Stack not empty.");
    LogMessage::~LogMessage(in_RDI);
    while (sVar1 = std::
                   stack<re2::WalkState<int>,_std::deque<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>_>
                   ::size((stack<re2::WalkState<int>,_std::deque<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>_>
                           *)0x20faad), sVar1 != 0) {
      pvVar3 = std::
               stack<re2::WalkState<int>,_std::deque<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>_>
               ::top((stack<re2::WalkState<int>,_std::deque<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>_>
                      *)0x20fac1);
      if (pvVar3->child_args != (int *)0x0) {
        operator_delete(pvVar3->child_args);
      }
      std::
      stack<re2::WalkState<int>,_std::deque<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>_>
      ::pop((stack<re2::WalkState<int>,_std::deque<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>_>
             *)0x20fae8);
    }
  }
  return;
}

Assistant:

void Regexp::Walker<T>::Reset() {
  if (stack_ && stack_->size() > 0) {
    LOG(DFATAL) << "Stack not empty.";
    while (stack_->size() > 0) {
      delete stack_->top().child_args;
      stack_->pop();
    }
  }
}